

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

optional<pbrt::CameraRayDifferential> * __thiscall
pbrt::CameraHandle::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,CameraHandle *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  short sVar1;
  uintptr_t iptr;
  undefined7 uVar2;
  CameraHandle local_10;
  
  uVar2 = (undefined7)((ulong)lambda >> 8);
  local_10 = (CameraHandle)
             (this->
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             ).bits;
  sVar1 = (short)((ulong)local_10.
                         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                         .bits >> 0x30);
  if ((ulong)local_10.
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits >> 0x30 < 3) {
    if (sVar1 == 2) {
      OrthographicCamera::GenerateRayDifferential
                (__return_storage_ptr__,
                 (OrthographicCamera *)
                 ((ulong)local_10.
                         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                         .bits & 0xffffffffffff),sample,(SampledWavelengths *)CONCAT71(uVar2,0x30));
    }
    else {
      PerspectiveCamera::GenerateRayDifferential
                (__return_storage_ptr__,
                 (PerspectiveCamera *)
                 ((ulong)local_10.
                         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                         .bits & 0xffffffffffff),sample,(SampledWavelengths *)CONCAT71(uVar2,0x30));
    }
  }
  else {
    if (sVar1 != 3) {
      local_10.
      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
      .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
               )((ulong)local_10.
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        .bits & 0xffffffffffff | 0x4000000000000);
    }
    CameraBase::GenerateRayDifferential(__return_storage_ptr__,&local_10,sample,lambda);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRayDifferential> CameraHandle::GenerateRayDifferential(
    CameraSample sample, SampledWavelengths &lambda) const {
    auto gen = [&](auto ptr) { return ptr->GenerateRayDifferential(sample, lambda); };
    return Dispatch(gen);
}